

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expression.h
# Opt level: O3

Product * __thiscall
lossless_neural_sound::expression_compiler::expression::Nodes::
intern<lossless_neural_sound::expression_compiler::expression::Product>
          (Nodes *this,Arena *arena,Product *new_node)

{
  pointer ppNVar1;
  int iVar2;
  undefined4 extraout_var;
  Expression_node *new_node_00;
  Expression_node *pEVar3;
  ostream *poVar4;
  Node *pNVar5;
  ulong uVar6;
  undefined4 extraout_var_00;
  
  iVar2 = (*(new_node->
            super_Balanced_tree<lossless_neural_sound::expression_compiler::expression::Product>).
            super_Expression_node.super_Node._vptr_Node[2])(new_node);
  uVar6 = CONCAT44(extraout_var,iVar2) % 0x1fff;
  ppNVar1 = (this->hash_table).
            super__Vector_base<const_lossless_neural_sound::expression_compiler::expression::Node_*,_std::allocator<const_lossless_neural_sound::expression_compiler::expression::Node_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pNVar5 = ppNVar1[uVar6];
  while( true ) {
    if (pNVar5 == (Node *)0x0) {
      iVar2 = (*(new_node->
                super_Balanced_tree<lossless_neural_sound::expression_compiler::expression::Product>
                ).super_Expression_node.super_Node._vptr_Node[5])(new_node,arena);
      new_node_00 = (Expression_node *)CONCAT44(extraout_var_00,iVar2);
      (new_node_00->super_Node).hash_next = ppNVar1[uVar6];
      ppNVar1[uVar6] = (Node *)new_node_00;
      pEVar3 = Expression_node::AA_tree_node::insert(this->expression_tree_root,new_node_00);
      this->expression_tree_root = pEVar3;
      uVar6 = this->node_count + 1;
      this->node_count = uVar6;
      if ((uVar6 & 0xfff) == 0) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"node_count = ",0xd);
        poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
        std::ostream::put((char)poVar4);
        std::ostream::flush();
      }
      return (Product *)new_node_00;
    }
    iVar2 = (*(new_node->
              super_Balanced_tree<lossless_neural_sound::expression_compiler::expression::Product>).
              super_Expression_node.super_Node._vptr_Node[3])(new_node);
    if ((char)iVar2 != '\0') break;
    pNVar5 = ppNVar1[uVar6]->hash_next;
    ppNVar1[uVar6] = pNVar5;
  }
  return (Product *)ppNVar1[uVar6];
}

Assistant:

const T *intern(Arena &arena, T &&new_node)
    {
        auto &&node_reference = to_node_reference(std::forward<T>(new_node));
        std::size_t hash = node_reference.hash();
        auto &table_entry = hash_table[hash % get_hash_table_size()];
        for(const Node **pnode = &table_entry; *pnode; *pnode = (*pnode)->hash_next)
        {
            if(node_reference.same(*pnode))
            {
                const Node *node = *pnode;
                if(node != table_entry)
                {
                    *pnode = node->hash_next;
                    node->hash_next = table_entry;
                    table_entry = node;
                }
                return static_cast<const T *>(node);
            }
        }
        const Node *node = std::forward<decltype(node_reference)>(node_reference).reallocate(arena);
        node->hash_next = table_entry;
        table_entry = node;
        auto retval = static_cast<const T *>(node);
        on_insert_node(retval);
        if(++node_count % 0x1000 == 0)
            std::cout << "node_count = " << node_count << std::endl;
        return retval;
    }